

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::ExtractSubrange
          (RepeatedField<unsigned_int> *this,int start,int num,uint *elements)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (elements != (uint *)0x0) {
    uVar3 = 0;
    uVar5 = 0;
    if (0 < num) {
      uVar5 = (ulong)(uint)num;
    }
    pvVar2 = this->arena_or_elements_;
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      elements[uVar3] = *(uint *)((long)pvVar2 + uVar3 * 4 + (long)start * 4);
    }
  }
  if (0 < num) {
    pvVar2 = this->arena_or_elements_;
    for (lVar4 = (long)(start + num); iVar1 = this->current_size_, lVar4 < iVar1; lVar4 = lVar4 + 1)
    {
      *(undefined4 *)((long)pvVar2 + lVar4 * 4 + (ulong)(uint)num * -4) =
           *(undefined4 *)((long)pvVar2 + lVar4 * 4);
    }
    if (0 < iVar1) {
      this->current_size_ = iVar1 - num;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}